

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::SaveServerlist(CServerBrowser *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  long lVar3;
  long in_FS_OFFSET;
  CJsonWriter Writer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                    (this->m_pStorage,"serverlist.json",2,0,0,0,0,0);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar2) != (IOHANDLE)0x0) {
    CJsonWriter::CJsonWriter(&Writer,(IOHANDLE)CONCAT44(extraout_var,iVar2));
    CJsonWriter::BeginObject(&Writer);
    CJsonWriter::WriteAttribute(&Writer,"serverlist");
    CJsonWriter::BeginArray(&Writer);
    for (lVar3 = 0; lVar3 < this->m_aServerlist[0].m_NumServers; lVar3 = lVar3 + 1) {
      CJsonWriter::WriteStrValue
                (&Writer,(this->m_aServerlist[0].m_ppServerlist[lVar3]->m_Info).m_aAddress);
    }
    CJsonWriter::EndArray(&Writer);
    CJsonWriter::EndObject(&Writer);
    CJsonWriter::~CJsonWriter(&Writer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::SaveServerlist()
{
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);
	Writer.BeginObject(); // root
	Writer.WriteAttribute("serverlist");
	Writer.BeginArray();
	for(int i = 0; i < m_aServerlist[IServerBrowser::TYPE_INTERNET].m_NumServers; ++i)
		Writer.WriteStrValue(m_aServerlist[IServerBrowser::TYPE_INTERNET].m_ppServerlist[i]->m_Info.m_aAddress);
	Writer.EndArray();
	Writer.EndObject();
}